

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemNulTerminate(Mem *pMem)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = pMem->flags & 0x202;
  if ((short)uVar2 != 2) {
    return uVar2;
  }
  iVar3 = sqlite3VdbeMemGrow(pMem,pMem->n + 2,1);
  if (iVar3 == 0) {
    iVar3 = 0;
    pMem->z[pMem->n] = '\0';
    pMem->z[(long)pMem->n + 1] = '\0';
    pbVar1 = (byte *)((long)&pMem->flags + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  else {
    iVar3 = 7;
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemNulTerminate(Mem *pMem){
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  testcase( (pMem->flags & (MEM_Term|MEM_Str))==(MEM_Term|MEM_Str) );
  testcase( (pMem->flags & (MEM_Term|MEM_Str))==0 );
  if( (pMem->flags & (MEM_Term|MEM_Str))!=MEM_Str ){
    return SQLITE_OK;   /* Nothing to do */
  }else{
    return vdbeMemAddTerminator(pMem);
  }
}